

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O0

void __thiscall
FFont::FFont(FFont *this,char *name,char *nametemplate,int first,int count,int start,int fdlump,
            int spacewidth)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  CharData *pCVar7;
  BYTE *pBVar8;
  char *pcVar9;
  FTexture *pFVar10;
  FFontChar1 *this_00;
  byte local_ce;
  bool local_99;
  int yoffs;
  int height;
  FTexture *pic;
  FTextureID local_68;
  FTextureID local_64;
  int local_60;
  byte local_4e;
  bool local_4d;
  int local_4c;
  bool stcfn121;
  bool doomtemplate;
  void *pvStack_48;
  int maxyoffs;
  FTexture **charlumps;
  char buffer [12];
  FTextureID lump;
  int i;
  int start_local;
  int count_local;
  int first_local;
  char *nametemplate_local;
  char *name_local;
  FFont *this_local;
  
  this->_vptr_FFont = (_func_int **)&PTR__FFont_00b6e820;
  TArray<FRemapTable,_FRemapTable>::TArray(&this->Ranges);
  FTextureID::FTextureID((FTextureID *)(buffer + 4));
  if ((gameinfo.gametype & GAME_DoomChex) == GAME_Any) {
    local_99 = false;
  }
  else {
    iVar4 = strncmp(nametemplate,"STCFN",5);
    local_99 = iVar4 == 0;
  }
  local_4d = local_99;
  local_4e = 0;
  this->Lump = fdlump;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)count;
  uVar6 = SUB168(auVar1 * ZEXT816(0x10),0);
  if (SUB168(auVar1 * ZEXT816(0x10),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  pCVar7 = (CharData *)operator_new__(uVar6);
  this->Chars = pCVar7;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)count;
  uVar6 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  pvStack_48 = operator_new__(uVar6);
  pBVar8 = (BYTE *)operator_new__(0x100);
  this->PatchRemap = pBVar8;
  this->FirstChar = first;
  this->LastChar = first + -1 + count;
  this->FontHeight = 0;
  this->GlobalKerning = 0;
  pcVar9 = copystring(name);
  this->Name = pcVar9;
  this->Next = FirstFont;
  FirstFont = this;
  this->Cursor = '_';
  local_4c = 0;
  buffer[8] = '\0';
  buffer[9] = '\0';
  buffer[10] = '\0';
  buffer[0xb] = '\0';
  for (; (int)buffer._8_4_ < count; buffer._8_4_ = buffer._8_4_ + 1) {
    *(undefined8 *)((long)pvStack_48 + (long)(int)buffer._8_4_ * 8) = 0;
    mysnprintf((char *)&charlumps,0xc,nametemplate,(ulong)(uint)(buffer._8_4_ + start));
    local_60 = (int)FTextureManager::CheckForTexture(&TexMan,(char *)&charlumps,8,1);
    buffer._4_4_ = local_60;
    if ((((local_4d & 1U) != 0) && (bVar3 = FTextureID::isValid((FTextureID *)(buffer + 4)), bVar3))
       && (buffer._8_4_ + start == 0x79)) {
      local_64 = FTextureManager::CheckForTexture(&TexMan,"STCFN120",8,1);
      bVar3 = FTextureID::isValid(&local_64);
      local_ce = 1;
      if (bVar3) {
        local_68 = FTextureManager::CheckForTexture(&TexMan,"STCFN122",8,1);
        bVar3 = FTextureID::isValid(&local_68);
        local_ce = bVar3 ^ 0xff;
      }
      if ((local_ce & 1) != 0) {
        if (0x7c - start < count) {
          pFVar10 = FTextureManager::operator[](&TexMan,(FTextureID)buffer._4_4_);
          *(FTexture **)((long)pvStack_48 + (long)(0x7c - start) * 8) = pFVar10;
        }
        FTextureID::SetInvalid((FTextureID *)(buffer + 4));
        local_4e = 1;
      }
    }
    bVar3 = FTextureID::isValid((FTextureID *)(buffer + 4));
    if ((bVar3) &&
       (pFVar10 = FTextureManager::operator[](&TexMan,(FTextureID)buffer._4_4_),
       pFVar10 != (FTexture *)0x0)) {
      if ((buffer._8_4_ != 0x7c - start) || ((local_4e & 1) == 0)) {
        *(FTexture **)((long)pvStack_48 + (long)(int)buffer._8_4_ * 8) = pFVar10;
      }
      iVar5 = FTexture::GetScaledHeight(pFVar10);
      iVar4 = FTexture::GetScaledTopOffset(pFVar10);
      if (local_4c < iVar4) {
        local_4c = iVar4;
      }
      if (iVar4 < 1) {
        iVar4 = -iVar4;
      }
      if (this->FontHeight < iVar4 + iVar5) {
        this->FontHeight = iVar4 + iVar5;
      }
    }
    if (*(long *)((long)pvStack_48 + (long)(int)buffer._8_4_ * 8) == 0) {
      this->Chars[(int)buffer._8_4_].Pic = (FTexture *)0x0;
      this->Chars[(int)buffer._8_4_].XMove = -0x80000000;
    }
    else {
      this_00 = (FFontChar1 *)operator_new(0xb0);
      FFontChar1::FFontChar1(this_00,*(FTexture **)((long)pvStack_48 + (long)(int)buffer._8_4_ * 8))
      ;
      this->Chars[(int)buffer._8_4_].Pic = (FTexture *)this_00;
      iVar4 = FTexture::GetScaledWidth(this->Chars[(int)buffer._8_4_].Pic);
      this->Chars[(int)buffer._8_4_].XMove = iVar4;
    }
  }
  if (spacewidth == -1) {
    if (((0x4e - first < 0) || (count <= 0x4e - first)) ||
       (this->Chars[0x4e - first].Pic == (FTexture *)0x0)) {
      this->SpaceWidth = 4;
    }
    else {
      this->SpaceWidth = (this->Chars[0x4e - first].XMove + 1) / 2;
    }
  }
  else {
    this->SpaceWidth = spacewidth;
  }
  FixXMoves(this);
  (*this->_vptr_FFont[4])();
  if (pvStack_48 != (void *)0x0) {
    operator_delete__(pvStack_48);
  }
  return;
}

Assistant:

FFont::FFont (const char *name, const char *nametemplate, int first, int count, int start, int fdlump, int spacewidth)
{
	int i;
	FTextureID lump;
	char buffer[12];
	FTexture **charlumps;
	int maxyoffs;
	bool doomtemplate = gameinfo.gametype & GAME_DoomChex ? strncmp (nametemplate, "STCFN", 5) == 0 : false;
	bool stcfn121 = false;

	Lump = fdlump;
	Chars = new CharData[count];
	charlumps = new FTexture *[count];
	PatchRemap = new BYTE[256];
	FirstChar = first;
	LastChar = first + count - 1;
	FontHeight = 0;
	GlobalKerning = false;
	Name = copystring (name);
	Next = FirstFont;
	FirstFont = this;
	Cursor = '_';

	maxyoffs = 0;

	for (i = 0; i < count; i++)
	{
		charlumps[i] = NULL;
		mysnprintf (buffer, countof(buffer), nametemplate, i + start);

		lump = TexMan.CheckForTexture(buffer, FTexture::TEX_MiscPatch);
		if (doomtemplate && lump.isValid() && i + start == 121)
		{ // HACKHACK: Don't load STCFN121 in doom(2), because
		  // it's not really a lower-case 'y' but a '|'.
		  // Because a lot of wads with their own font seem to foolishly
		  // copy STCFN121 and make it a '|' themselves, wads must
		  // provide STCFN120 (x) and STCFN122 (z) for STCFN121 to load as a 'y'.
			if (!TexMan.CheckForTexture("STCFN120", FTexture::TEX_MiscPatch).isValid() ||
				!TexMan.CheckForTexture("STCFN122", FTexture::TEX_MiscPatch).isValid())
			{
				// insert the incorrectly named '|' graphic in its correct position.
				if (count > 124-start) charlumps[124-start] = TexMan[lump];
				lump.SetInvalid();
				stcfn121 = true;
			}
		}

		if (lump.isValid())
		{
			FTexture *pic = TexMan[lump];
			if (pic != NULL)
			{
				// set the lump here only if it represents a valid texture
				if (i != 124-start || !stcfn121)
					charlumps[i] = pic;

				int height = pic->GetScaledHeight();
				int yoffs = pic->GetScaledTopOffset();

				if (yoffs > maxyoffs)
				{
					maxyoffs = yoffs;
				}
				height += abs (yoffs);
				if (height > FontHeight)
				{
					FontHeight = height;
				}
			}
		}

		if (charlumps[i] != NULL)
		{
			Chars[i].Pic = new FFontChar1 (charlumps[i]);
			Chars[i].XMove = Chars[i].Pic->GetScaledWidth();
		}
		else
		{
			Chars[i].Pic = NULL;
			Chars[i].XMove = INT_MIN;
		}
	}

	if (spacewidth != -1)
	{
		SpaceWidth = spacewidth;
	}
	else if ('N'-first >= 0 && 'N'-first < count && Chars['N' - first].Pic != NULL)
	{
		SpaceWidth = (Chars['N' - first].XMove + 1) / 2;
	}
	else
	{
		SpaceWidth = 4;
	}

	FixXMoves();

	LoadTranslations();

	delete[] charlumps;
}